

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O3

void duckdb::ConstantFillFunctionValidity
               (ColumnSegment *segment,Vector *result,idx_t start_idx,idx_t count)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  _Head_base<0UL,_unsigned_long_*,_false> _Var6;
  idx_t idx_in_entry;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  bVar4 = BaseStatistics::CanHaveNull(&(segment->stats).statistics);
  if (bVar4) {
    FlatVector::VerifyFlatVector(result);
    if (count != 0) {
      _Var6._M_head_impl =
           (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      do {
        if (_Var6._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_48,&local_38);
          p_Var3 = p_Stack_40;
          peVar2 = local_48;
          local_48 = (element_type *)0x0;
          p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar2;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var3;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
            }
          }
          pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data);
          _Var6._M_head_impl =
               (pTVar5->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var6._M_head_impl;
        }
        bVar1 = (byte)start_idx & 0x3f;
        _Var6._M_head_impl[start_idx >> 6] =
             _Var6._M_head_impl[start_idx >> 6] &
             (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
        start_idx = start_idx + 1;
        count = count - 1;
      } while (count != 0);
    }
  }
  return;
}

Assistant:

void ConstantFillFunctionValidity(ColumnSegment &segment, Vector &result, idx_t start_idx, idx_t count) {
	auto &stats = segment.stats.statistics;
	if (stats.CanHaveNull()) {
		auto &mask = FlatVector::Validity(result);
		for (idx_t i = 0; i < count; i++) {
			mask.SetInvalid(start_idx + i);
		}
	}
}